

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O0

void __thiscall CShInstruction::~CShInstruction(CShInstruction *this)

{
  CShInstruction *this_local;
  
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CShInstruction_002b2a90;
  ShRegisterData::~ShRegisterData(&this->registerData);
  ShImmediateData::~ShImmediateData(&this->immediateData);
  CAssemblerCommand::~CAssemblerCommand(&this->super_CAssemblerCommand);
  return;
}

Assistant:

CShInstruction::~CShInstruction() = default;